

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O2

void Interactor_Input_Event_Notify(Am_Object *event_window,Am_Input_Event *ev)

{
  undefined4 value;
  Deferred_Event_Holder *pDVar1;
  undefined4 value_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  Am_Inter_State AVar9;
  int iVar10;
  Am_Value *pAVar11;
  bool *pbVar12;
  Am_Wrapper *pAVar13;
  Am_Priority_List *this;
  Am_Value *pAVar14;
  Deferred_Event_Holder *pDVar15;
  Am_Value_List *pAVar16;
  ostream *poVar17;
  ushort uVar18;
  uint uVar19;
  uint uVar20;
  Am_Object *pAVar21;
  Am_Object obj_1;
  Am_Object owner_1;
  bool abort;
  bool start;
  float local_144;
  float this_priority;
  Am_Input_Char deferring;
  Am_Object local_138;
  Am_Object local_130;
  Am_Object inter_1;
  Am_Value run_also_value;
  Am_Object head;
  int local_f0;
  int iStack_ec;
  Am_Value local_e0;
  Am_Object local_d0;
  uint local_c8;
  uint local_c4;
  Am_Object owner;
  anon_union_8_8_ea4c8939_for_value local_b8;
  Am_Object local_b0;
  ulong local_a8;
  Am_Object run_also_object;
  Am_Object inter;
  Am_Value_List run_also_list;
  Am_Value inter_list_value;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  bVar4 = Am_Value_List::Empty(&Am_Modal_Windows);
  if (!bVar4) {
    head.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start(&Am_Modal_Windows);
    pAVar11 = Am_Value_List::Get(&Am_Modal_Windows);
    Am_Object::operator=(&head,pAVar11);
    bVar4 = Am_Object::operator==(&head,event_window);
    if (!bVar4) {
      Am_Object::Get_Owner(&owner,(Am_Slot_Flags)event_window);
      while (bVar4 = Am_Object::Valid(&owner), bVar4) {
        Am_Object::Am_Object(&inter_1,&Am_Screen);
        bVar4 = Am_Object::Is_Instance_Of(&owner,&inter_1);
        Am_Object::~Am_Object(&inter_1);
        if (bVar4) break;
        bVar4 = Am_Object::operator==(&owner,&head);
        if (bVar4) {
          Am_Object::~Am_Object(&owner);
          goto LAB_001bac67;
        }
        Am_Object::Get_Owner((Am_Object *)&inter_list_value,(Am_Slot_Flags)&owner);
        Am_Object::operator=(&owner,(Am_Object *)&inter_list_value);
        Am_Object::~Am_Object((Am_Object *)&inter_list_value);
      }
      uVar18 = *(ushort *)&(ev->input_char).field_0x2;
      if ((uVar18 & 0xf0) == 0x10 || (uVar18 & 0xf00) == 0) {
        Am_Object::Am_Object((Am_Object *)&run_also_value,&Am_No_Object);
        Am_Beep((Am_Object *)&run_also_value);
        Am_Object::~Am_Object((Am_Object *)&run_also_value);
      }
      Am_Object::~Am_Object(&owner);
      Am_Object::~Am_Object(&head);
      return;
    }
LAB_001bac67:
    Am_Object::~Am_Object(&head);
  }
  if (Am_List_Of_Deferred_Events != (Deferred_Event_Holder *)0x0) {
    local_130.data = (Am_Object_Data *)0x0;
    bVar4 = false;
    pDVar15 = Am_List_Of_Deferred_Events;
    do {
      pDVar1 = pDVar15->next;
      start = false;
      abort = false;
      uVar18 = *(ushort *)&(ev->input_char).field_0x2;
      pbVar12 = &abort;
      if ((uVar18 & 0xf00) == 0 || (uVar18 & 0xf0) == 0x10) goto LAB_001bad70;
      bVar5 = Am_Object::operator!=(&pDVar15->event_window,event_window);
      if (bVar5) {
LAB_001bad52:
        uVar18 = *(ushort *)&(pDVar15->want_ic).field_0x2 >> 4 & 0xf;
        pbVar12 = &start;
        if (uVar18 == 5) goto LAB_001bad70;
        if (uVar18 == 4) {
          pbVar12 = &abort;
          goto LAB_001bad70;
        }
      }
      else {
        iVar8 = pDVar15->x - ev->x;
        iVar10 = -iVar8;
        if (0 < iVar8) {
          iVar10 = iVar8;
        }
        if (Am_Minimum_Move_For_Drag <= iVar10) goto LAB_001bad52;
        uVar19 = pDVar15->y - ev->y;
        uVar20 = -uVar19;
        if (0 < (int)uVar19) {
          uVar20 = uVar19;
        }
        if ((uint)Am_Minimum_Move_For_Drag <= uVar20) goto LAB_001bad52;
        if ((*(ushort *)&(ev->input_char).field_0x2 & 0xf0) != 0x20) goto LAB_001bad73;
        uVar18 = *(ushort *)&(pDVar15->want_ic).field_0x2 >> 4 & 0xf;
        pbVar12 = &abort;
        if (uVar18 != 5) {
          if (uVar18 != 4) goto LAB_001bad73;
          pbVar12 = &start;
        }
LAB_001bad70:
        *pbVar12 = true;
      }
LAB_001bad73:
      if (start == true) {
        Am_Object::Am_Object(&inter_1,&pDVar15->inter);
        Am_Object::Am_Object((Am_Object *)&inter_list_value,&inter_1);
        Check_And_Handle_Trace_Next_Inter((Am_Object *)&inter_list_value);
        Am_Object::~Am_Object((Am_Object *)&inter_list_value);
        Am_Object::Am_Object((Am_Object *)&run_also_value,&pDVar15->event_window);
        Am_Object::Am_Object((Am_Object *)&run_also_list,&pDVar15->obj);
        Am_Input_Event::Am_Input_Event((Am_Input_Event *)&head);
        value = pDVar15->x;
        value_00 = pDVar15->y;
        Am_Input_Char::operator=((Am_Input_Char *)&head,&pDVar15->got_ic);
        Am_Object::Am_Object(&owner_1,(Am_Object *)&run_also_value);
        Get_a_drawonable(&owner_1);
        Am_Object::~Am_Object(&owner_1);
        Am_List_Of_Deferred_Events = pDVar15->next;
        Deferred_Event_Holder::~Deferred_Event_Holder(pDVar15);
        operator_delete(pDVar15);
        pAVar13 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&run_also_value);
        Am_Object::Set(&inter_1,0x68,pAVar13,0);
        pAVar13 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&run_also_list);
        Am_Object::Set(&inter_1,0x11a,pAVar13,0);
        pAVar13 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&run_also_list);
        Am_Object::Set(&inter_1,0x119,pAVar13,0);
        Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&head);
        Am_Object::Set(&inter_1,0x11b,(Am_Value *)&owner,0);
        Am_Value::~Am_Value((Am_Value *)&owner);
        Am_Object::Set(&inter_1,0x11f,value,0);
        Am_Object::Set(&inter_1,0x120,value_00,0);
        Am_Object::Set(&inter_1,0x121,value,0);
        Am_Object::Set(&inter_1,0x122,value_00,0);
        pAVar11 = Am_Object::Get(&inter_1,0xbe,0);
        Am_Inter_Internal_Method::Am_Inter_Internal_Method
                  ((Am_Inter_Internal_Method *)&owner,pAVar11);
        (*local_b8.proc_value)(&inter_1,&run_also_list,&run_also_value);
        bVar4 = Am_Object::Valid((Am_Object *)&run_also_value);
        if (bVar4) {
          Am_Object::Am_Object(&local_d0,(Am_Object *)&run_also_value);
          set_want_move_one_win(&local_d0,false);
          Am_Object::~Am_Object(&local_d0);
        }
        Am_Value::~Am_Value(&local_e0);
        Am_Object::~Am_Object((Am_Object *)&run_also_list);
        Am_Object::~Am_Object((Am_Object *)&run_also_value);
        Am_Object::~Am_Object(&inter_1);
LAB_001bb002:
        bVar4 = true;
      }
      else if (abort == true) {
        Am_Object::Am_Object(&head,&pDVar15->event_window);
        set_want_move_one_win(&head,false);
        Am_Object::~Am_Object(&head);
        Am_List_Of_Deferred_Events = pDVar15->next;
        Deferred_Event_Holder::~Deferred_Event_Holder(pDVar15);
        operator_delete(pDVar15);
        goto LAB_001bb002;
      }
      pDVar15 = pDVar1;
    } while (pDVar1 != (Deferred_Event_Holder *)0x0);
    Am_Object::~Am_Object(&local_130);
    if (bVar4) {
      return;
    }
  }
  pAVar11 = Am_Object::Get(event_window,0x124,1);
  Am_Value::Am_Value(&inter_list_value,pAVar11);
  bVar4 = Am_Value::Valid(&inter_list_value);
  if (bVar4) {
    this = (Am_Priority_List *)Am_Value::operator_cast_to_void_(&inter_list_value);
  }
  else {
    this = (Am_Priority_List *)0x0;
  }
  inter.data = (Am_Object_Data *)0x0;
  run_also_value.type = 0;
  run_also_value.value.wrapper_value = (Am_Wrapper *)0x0;
  run_also_object.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&run_also_list);
  if (this != (Am_Priority_List *)0x0) {
    this->refs = this->refs + 1;
    Am_Priority_List::Start(this);
  }
  Am_Priority_List::Start(all_wins_inter_list);
  pAVar11 = &ev->user_id;
  local_144 = 0.0;
  local_a8 = 0;
  bVar5 = false;
  bVar7 = false;
  bVar4 = false;
LAB_001bb103:
  do {
    bVar3 = bVar4;
    bVar2 = bVar7;
    bVar4 = Am_Priority_List::Two_List_Get_Next(all_wins_inter_list,this,&inter,&this_priority);
    if (!bVar4) {
LAB_001bbd3f:
      if (this != (Am_Priority_List *)0x0) {
        Am_Priority_List::Release(this);
      }
      Am_Value_List::~Am_Value_List(&run_also_list);
      Am_Object::~Am_Object(&run_also_object);
      Am_Value::~Am_Value(&run_also_value);
      Am_Object::~Am_Object(&inter);
      Am_Value::~Am_Value(&inter_list_value);
      return;
    }
    bVar6 = Am_Object::Valid(&inter);
    bVar7 = bVar2;
    bVar4 = bVar3;
  } while (!bVar6);
  if (((bVar2) && ((local_a8 & 1) == 0)) && (this_priority < local_144)) goto LAB_001bbd3f;
  if (bVar3) {
    Am_Value_List::Start(&run_also_list);
  }
  if (bVar2) {
    if ((local_a8 & 1) == 0) {
      pAVar14 = Am_Object::Get(&inter,0x11c,0);
      bVar6 = Am_Value::Valid(pAVar14);
    }
    else {
      if ((bVar5) && (bVar4 = Am_Object::operator==(&inter,&run_also_object), bVar4))
      goto LAB_001bb1e0;
      bVar7 = true;
      bVar4 = false;
      if (!bVar3) goto LAB_001bb103;
      pAVar13 = Am_Object::operator_cast_to_Am_Wrapper_(&inter);
      bVar6 = Am_Value_List::Member(&run_also_list,pAVar13);
      bVar4 = true;
    }
    bVar7 = true;
    if (bVar6 == false) goto LAB_001bb103;
  }
LAB_001bb1e0:
  Am_Object::Set(&Am_Screen,499,pAVar11,0);
  pAVar14 = Am_Object::Get(&inter,0x1f1,1);
  bVar4 = Am_Value::operator==(pAVar14,-2);
  if (bVar4) {
    pAVar14 = Am_Object::Get(&inter,0x1f2,1);
    bVar4 = Am_Value::Valid(pAVar14);
    if ((bVar4) && (bVar4 = Am_Value::operator==(pAVar14,pAVar11), !bVar4)) {
      bVar6 = Am_Value::operator==(pAVar14,-2);
LAB_001bb27c:
      bVar7 = bVar2;
      bVar4 = bVar3;
      if (bVar6 == false) goto LAB_001bb103;
    }
  }
  else {
    bVar4 = Am_Value::operator==(pAVar14,-1);
    if (!bVar4) {
      bVar6 = Am_Value::operator==(pAVar14,pAVar11);
      goto LAB_001bb27c;
    }
  }
  inter_1.data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_38,&inter);
  AVar9 = Am_Get_Inter_State(&local_38);
  Am_Object::~Am_Object(&local_38);
  pAVar14 = Am_Object::Get(&inter,0xcc,0);
  bVar4 = Am_Value::operator_cast_to_bool(pAVar14);
  deferring = Am_No_Input_Char;
  obj_1.data = (Am_Object_Data *)0x0;
  if (bVar4) {
    if (AVar9 - Am_INTER_RUNNING < 2) {
      pAVar13 = Am_Object::operator_cast_to_Am_Wrapper_(event_window);
      Am_Object::Set(&inter,0x68,pAVar13,0);
      Am_Object::Set(&inter,0x121,ev->x,0);
      Am_Object::Set(&inter,0x122,ev->y,0);
      Am_Object::Am_Object(&local_50,&inter);
      Check_And_Handle_Trace_Next_Inter(&local_50);
      Am_Object::~Am_Object(&local_50);
      bVar4 = check_event(&inter,event_window,ev->input_char,0xbc,&deferring);
      if (bVar4) {
        pAVar14 = Am_Object::Get(&inter,0xd3,0);
        bVar4 = Am_Value::operator_cast_to_bool(pAVar14);
        if (bVar4) {
          Am_Object::Am_Object(&local_58,&Am_No_Object);
          Am_Beep(&local_58);
          Am_Object::~Am_Object(&local_58);
        }
        pAVar14 = Am_Object::Get(&inter,0xc4,0);
        Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar14);
        pAVar21 = &Am_No_Object;
LAB_001bb666:
        (*(code *)0x0)(&inter,pAVar21,event_window,ev);
      }
      else {
        local_c4 = ev->x;
        local_c8 = ev->y;
        local_138.data = (Am_Object_Data *)0x0;
        head.data = head.data & 0xffffffffffff0000;
        pAVar14 = Am_Object::Get(&inter,0xbb,1);
        Am_Value::operator=((Am_Value *)&head,pAVar14);
        if (((Am_Value_Type)head.data == 4) || ((Am_Value_Type)head.data == 2)) {
          bVar4 = Am_Value::Valid((Am_Value *)&head);
          pAVar21 = event_window;
          if (!bVar4) {
            pAVar21 = &Am_No_Object;
          }
          Am_Object::operator=(&local_138,pAVar21);
        }
        else {
          iVar10 = Am_Where_Method::Test((Am_Value *)&head);
          if (iVar10 == 0) {
            poVar17 = std::operator<<((ostream *)&std::cerr,
                                      "** Amulet Error: Contents of Am_RUNNING_WHERE_TEST slot");
            poVar17 = std::operator<<(poVar17," of inter ");
            poVar17 = operator<<(poVar17,&inter);
            std::operator<<(poVar17," is not Boolean or Am_Where_Method, type = ");
            Am_Print_Type((ostream *)&std::cerr,(Am_Value_Type)head.data);
            std::operator<<((ostream *)&std::cerr," Aborting\n");
            Am_Object::operator=(&local_138,&Am_No_Object);
            Am_Error(&inter,0xbb);
          }
          Am_Object::Get_Owner(&owner_1,(Am_Slot_Flags)&inter);
          Am_Object::Am_Object(&local_d0,&owner_1);
          bVar4 = Am_Object_And_Owners_Valid_And_Visible(&local_d0);
          Am_Object::~Am_Object(&local_d0);
          if (bVar4) {
            Am_Where_Method::Am_Where_Method((Am_Where_Method *)&owner,(Am_Value *)&head);
            Am_Object::Am_Object((Am_Object *)&start,&inter);
            Am_Object::Am_Object((Am_Object *)&abort,&owner_1);
            Am_Object::Am_Object(&local_b0,event_window);
            (*local_b8.proc_value)
                      (&local_130,&start,&abort,&local_b0,(ulong)local_c4,(ulong)local_c8);
            Am_Object::operator=(&local_138,&local_130);
            Am_Object::~Am_Object(&local_130);
            Am_Object::~Am_Object(&local_b0);
            Am_Object::~Am_Object((Am_Object *)&abort);
            Am_Object::~Am_Object((Am_Object *)&start);
          }
          Am_Object::~Am_Object(&owner_1);
        }
        Am_Value::~Am_Value((Am_Value *)&head);
        Am_Object::operator=(&obj_1,&local_138);
        Am_Object::~Am_Object(&local_138);
        bVar4 = check_event(&inter,event_window,ev->input_char,0xbd,&deferring);
        bVar7 = Am_Object::Valid(&obj_1);
        if (bVar7) {
          pAVar13 = Am_Object::operator_cast_to_Am_Wrapper_(&obj_1);
          Am_Object::Set(&inter,0x119,pAVar13,0);
          if (AVar9 == Am_INTER_OUTSIDE) {
            pAVar14 = Am_Object::Get(&inter,0xc1,0);
            Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar14);
            (*(code *)0x0)(&inter,&obj_1,event_window,ev);
          }
          pAVar14 = Am_Object::Get(&inter,(ushort)bVar4 + (ushort)bVar4 * 2 + 0xbf,0);
          Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar14);
          pAVar21 = &obj_1;
        }
        else {
          if (AVar9 == Am_INTER_RUNNING) {
            pAVar14 = Am_Object::Get(&inter,0xc0,0);
            Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar14);
            (*(code *)0x0)(&inter,&Am_No_Object,event_window,ev);
          }
          if (!bVar4) goto LAB_001bbb2c;
          pAVar14 = Am_Object::Get(&inter,0xc3,0);
          Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar14);
          pAVar21 = &Am_No_Object;
        }
        (*(code *)0x0)(&inter,pAVar21,event_window,ev);
      }
LAB_001bbb2c:
      Am_Object::~Am_Object(&obj_1);
      bVar4 = Am_Object::Valid(&inter);
      if (bVar4) {
        pAVar14 = Am_Object::Get(&inter,0x11c,1);
        Am_Value::operator=(&run_also_value,pAVar14);
        bVar4 = Am_Value::Valid(&run_also_value);
        if (bVar4) {
          bVar4 = Am_Value_List::Test(&run_also_value);
          if (bVar4) {
            pAVar16 = Am_Value_List::operator=(&run_also_list,&run_also_value);
            local_144 = this_priority;
            local_a8 = CONCAT71((int7)((ulong)pAVar16 >> 8),1);
            bVar7 = true;
            bVar4 = true;
          }
          else {
            bVar7 = bVar2;
            bVar4 = bVar3;
            if (run_also_value.type == 0xa001) {
              pAVar21 = Am_Object::operator=(&run_also_object,&run_also_value);
              local_144 = this_priority;
              local_a8 = CONCAT71((int7)((ulong)pAVar21 >> 8),1);
              bVar5 = true;
              bVar7 = true;
            }
          }
          goto LAB_001bb103;
        }
      }
      local_144 = this_priority;
      bVar7 = true;
      bVar4 = bVar3;
      goto LAB_001bb103;
    }
    if (AVar9 != Am_INTER_ANIMATING) {
      if (AVar9 != Am_INTER_WAITING) {
        poVar17 = std::operator<<((ostream *)&std::cerr,
                                  "** Amulet Error: Illegal state in Interactor ");
        poVar17 = operator<<(poVar17,&inter);
        std::endl<char,std::char_traits<char>>(poVar17);
        Am_Error(&inter,0x123);
      }
      bVar4 = check_event(&inter,event_window,ev->input_char,0xb9,&deferring);
      if (bVar4) {
        local_c4 = ev->x;
        local_c8 = ev->y;
        local_138.data = (Am_Object_Data *)0x0;
        head.data = head.data & 0xffffffffffff0000;
        Am_Object::Get_Owner(&owner_1,(Am_Slot_Flags)&inter);
        pAVar14 = Am_Object::Get(&inter,0xba,1);
        Am_Value::operator=((Am_Value *)&head,pAVar14);
        if (((Am_Value_Type)head.data == 4) || ((Am_Value_Type)head.data == 2)) {
          bVar4 = Am_Value::Valid((Am_Value *)&head);
          pAVar21 = &owner_1;
          if (!bVar4) {
            pAVar21 = &Am_No_Object;
          }
          Am_Object::operator=(&local_138,pAVar21);
        }
        else {
          iVar10 = Am_Where_Method::Test((Am_Value *)&head);
          if (iVar10 == 0) {
            poVar17 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
            poVar17 = std::operator<<(poVar17,"Am_START_WHERE_TEST of ");
            poVar17 = operator<<(poVar17,&inter);
            poVar17 = std::operator<<(poVar17," should be boolean or Am_Where_Method, but is ");
            poVar17 = operator<<(poVar17,(Am_Value *)&head);
            std::endl<char,std::char_traits<char>>(poVar17);
            Am_Error();
          }
          Am_Object::Am_Object(&local_d0,&owner_1);
          bVar4 = Am_Object_And_Owners_Valid_And_Visible(&local_d0);
          Am_Object::~Am_Object(&local_d0);
          if (bVar4) {
            Am_Where_Method::Am_Where_Method((Am_Where_Method *)&owner,(Am_Value *)&head);
            Am_Object::Am_Object((Am_Object *)&start,&inter);
            Am_Object::Am_Object((Am_Object *)&abort,&owner_1);
            Am_Object::Am_Object(&local_b0,event_window);
            (*local_b8.proc_value)
                      (&local_130,&start,&abort,&local_b0,(ulong)local_c4,(ulong)local_c8);
            Am_Object::operator=(&local_138,&local_130);
            Am_Object::~Am_Object(&local_130);
            Am_Object::~Am_Object(&local_b0);
            Am_Object::~Am_Object((Am_Object *)&abort);
            Am_Object::~Am_Object((Am_Object *)&start);
          }
        }
        Am_Object::~Am_Object(&owner_1);
        Am_Value::~Am_Value((Am_Value *)&head);
        Am_Object::operator=(&obj_1,&local_138);
        Am_Object::~Am_Object(&local_138);
        bVar4 = Am_Object::Valid(&obj_1);
        if (bVar4) {
          if (deferring.code == 0) {
            Am_Object::Am_Object(&local_48,&inter);
            Check_And_Handle_Trace_Next_Inter(&local_48);
            Am_Object::~Am_Object(&local_48);
            pAVar13 = Am_Object::operator_cast_to_Am_Wrapper_(event_window);
            Am_Object::Set(&inter,0x68,pAVar13,0);
            pAVar13 = Am_Object::operator_cast_to_Am_Wrapper_(&obj_1);
            Am_Object::Set(&inter,0x11a,pAVar13,0);
            pAVar13 = Am_Object::operator_cast_to_Am_Wrapper_(&obj_1);
            Am_Object::Set(&inter,0x119,pAVar13,0);
            Am_Input_Char::operator_cast_to_Am_Value(&ev->input_char);
            Am_Object::Set(&inter,0x11b,(Am_Value *)&head,0);
            Am_Value::~Am_Value((Am_Value *)&head);
            Am_Object::Set(&inter,0x11f,ev->x,0);
            Am_Object::Set(&inter,0x120,ev->y,0);
            Am_Object::Set(&inter,0x121,ev->x,0);
            Am_Object::Set(&inter,0x122,ev->y,0);
            pAVar14 = Am_Object::Get(&inter,0xbe,0);
            Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar14);
            pAVar21 = &obj_1;
            goto LAB_001bb666;
          }
          owner.data._0_4_ = deferring;
          pDVar15 = (Deferred_Event_Holder *)operator_new(0x30);
          Deferred_Event_Holder::Deferred_Event_Holder(pDVar15);
          Am_Object::operator=((Am_Object *)pDVar15,&inter);
          Am_Object::operator=(&pDVar15->obj,&obj_1);
          Am_Input_Char::operator=(&pDVar15->want_ic,(Am_Input_Char *)&owner);
          Am_Input_Char::operator=(&pDVar15->got_ic,&ev->input_char);
          iVar10 = ev->y;
          pDVar15->x = ev->x;
          pDVar15->y = iVar10;
          Am_Object::operator=(&pDVar15->event_window,event_window);
          pDVar15->next = Am_List_Of_Deferred_Events;
          Am_List_Of_Deferred_Events = pDVar15;
          Am_Object::Am_Object(&head,event_window);
          set_want_move_one_win(&head,true);
          Am_Object::~Am_Object(&head);
        }
      }
    }
  }
  else if (AVar9 != Am_INTER_WAITING) {
    pAVar14 = Am_Object::Get(&inter,0xd3,0);
    bVar4 = Am_Value::operator_cast_to_bool(pAVar14);
    if (bVar4) {
      Am_Object::Am_Object(&local_40,&Am_No_Object);
      Am_Beep(&local_40);
      Am_Object::~Am_Object(&local_40);
    }
    pAVar14 = Am_Object::Get(&inter,0xc4,0);
    Am_Inter_Internal_Method::operator=((Am_Inter_Internal_Method *)&inter_1,pAVar14);
    (*(code *)0x0)(&inter,&Am_No_Object,event_window,ev);
  }
  Am_Object::~Am_Object(&obj_1);
  bVar7 = bVar2;
  bVar4 = bVar3;
  goto LAB_001bb103;
}

Assistant:

static void
Interactor_Input_Event_Notify(Am_Object event_window, Am_Input_Event *ev)
{
  //first check if modal window
  if (check_modal_windows(event_window, ev))
    return;

  //now check if a deferred interactor wants this event
  if (check_deferred_events(ev, event_window)) {
    return;
  }

#ifdef DEBUG
  int was_inprogress =
      event_window.Get(Am_OBJECT_IN_PROGRESS, Am_RETURN_ZERO_ON_ERROR);
  if (was_inprogress & 2) {
    std::cerr << "** Processing events for window " << event_window
              << " but crashed last time, so skipping it.\n"
              << std::flush;
    return; //skip this object
  } else
    event_window.Set(Am_OBJECT_IN_PROGRESS, 2, Am_OK_IF_NOT_THERE);
#endif

  Am_Value inter_list_value = event_window.Peek(Am_INTER_LIST);
  Am_Priority_List *inter_list;
  bool wants_event;

  if (inter_list_value.Valid()) {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                         "----Interactors for window " << event_window);
    inter_list = Am_Priority_List::Narrow(inter_list_value);
  } else {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_PRIORITIES,
                         "----NO Interactors for window " << event_window);
    // no interactor list, still have to check global ones so don't exit
    inter_list = nullptr;
  }

  // process all the interactors in inter_list in priority order

  Am_Object inter;
  Am_Value run_also_value;
  Am_Object run_also_object;
  Am_Value_List run_also_list;
  bool doing_RUN_ALSO_only = false; //true if found an inter w/run_also
  bool check_RUN_ALSO_list_or_object = false;
  bool check_RUN_ALSO_object = false;
  bool check_RUN_ALSO_list = false;
  float run_also_priority = 0.0f;
  float this_priority;

  if (inter_list) {
    inter_list->Note_Reference();
    inter_list->Start();
  }
  all_wins_inter_list->Start();

  //std::cout <<"\nGlobal list: " << *all_wins_inter_list << endl
  //  << "List of " << event_window << " = " << *inter_list <<std::endl <<std::flush;

  while (all_wins_inter_list->Two_List_Get_Next(inter_list, inter,
                                                this_priority)) {
    //go through inter_list and all_wins_inter_list in parallel,
    //always getting the next priority inter from each

    // std::cout << "-<.> processing " << inter << " doing_RUN_ALSO_only "
    //      << doing_RUN_ALSO_only << " check_RUN_ALSO_list_or_object "
    //      << check_RUN_ALSO_list_or_object << " run_also_object= "
    //	  << run_also_object << " run_also_list " << run_also_list
    //	  <<std::endl <<std::flush;

    // Sometimes the window gets destroyed and all these interactors are
    // destroyed as well.  Must check to make sure interactors are okay.
    if (!inter.Valid())
      continue;

    if (doing_RUN_ALSO_only &&
        !check_RUN_ALSO_list_or_object) { // then found a regular inter, stop when priority is lower than
      // run_also_priority
      if (this_priority < run_also_priority)
        break; // then done.
    }          // end if (doing_RUN_ALSO_only)

    // std::cout << "__check " << inter << " doing run also=" << doing_RUN_ALSO_only
    //   << " inter runalso=" << (bool)inter.Get(Am_RUN_ALSO) <<std::endl <<std::flush;

    if (check_RUN_ALSO_list)
      run_also_list.Start();

    if ((!doing_RUN_ALSO_only ||
         (check_RUN_ALSO_list_or_object &&
              // if the run_also object is set then inter must be that object
              ((check_RUN_ALSO_object && inter == run_also_object) ||
          // if the run_also list is set then inter must be member of list
          (check_RUN_ALSO_list && run_also_list.Member(inter)))) ||
         //inter itself is a run_also
         (!check_RUN_ALSO_list_or_object && inter.Get(Am_RUN_ALSO).Valid())) &&
        // supports multiple users
        inter_is_go_for_user_and_event(inter, ev)) {
      //--> The actual running of the Interactor is here <--//
      wants_event = Inter_Check_Go(inter, ev, event_window);

      if (wants_event) {
        // Found one to run.  If it is not a RUN_ALSO_only, then only
        // run the RUN_ALSO interactors of the same priority level.
        // If it is a RUN_ALSO, then just keep going.
        // Be sure to fetch Am_RUN_ALSO again after Inter_Check_Go in
        // case changed by the running.
        if (inter.Valid()) {
          //inter might be destroyed while running
          run_also_value = inter.Peek(Am_RUN_ALSO);
          if (!run_also_value.Valid()) {
            //when Am_RUN_ALSO is not valid, then only run other
            // RUN_ALSO interactors.
            doing_RUN_ALSO_only = true;
            run_also_priority = this_priority;
          } else { //valid, see if object or list or ==true
            if (Am_Value_List::Test(run_also_value)) {
              run_also_list = run_also_value;
              doing_RUN_ALSO_only = true;
              run_also_priority = this_priority;
              check_RUN_ALSO_list = true;
              check_RUN_ALSO_list_or_object = true;
            } else if (run_also_value.type == Am_OBJECT) {
              run_also_object = run_also_value;
              doing_RUN_ALSO_only = true;
              run_also_priority = this_priority;
              check_RUN_ALSO_object = true;
              check_RUN_ALSO_list_or_object = true;
            }
            //else must be ==true, so continue to run other
            //interactors (leave doing_RUN_ALSO_only as false)
          }
        } else {
          // inter destroyed while running, but still only run other
          // run_also interactors.
          doing_RUN_ALSO_only = true;
          run_also_priority = this_priority;
        }
      }
    }
  }
  if (inter_list)
    inter_list->Release();
#ifdef DEBUG
  if (event_window.Valid()) //may not be valid while destroying window
    event_window.Set(Am_OBJECT_IN_PROGRESS, 0, Am_OK_IF_NOT_THERE);
#endif
}